

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3SegReaderCursor(Fts3Table *p,int iLangid,int iIndex,int iLevel,char *zTerm,int nTerm,
                       int isPrefix,int isScan,Fts3MultiSegReader *pCsr)

{
  int iVar1;
  sqlite3_int64 iEndBlock_00;
  char *zNode;
  bool bVar2;
  bool local_b1;
  sqlite3_int64 *local_b0;
  bool local_81;
  sqlite3_int64 *pi;
  char *zRoot;
  int nRoot;
  sqlite3_int64 iEndBlock;
  sqlite3_int64 iLeavesEndBlock;
  sqlite3_int64 iStartBlock;
  Fts3SegReader *pSeg_1;
  Fts3SegReader *pSeg;
  sqlite3_stmt *psStack_38;
  int rc2;
  sqlite3_stmt *pStmt;
  int rc;
  int nTerm_local;
  char *zTerm_local;
  int local_18;
  int iLevel_local;
  int iIndex_local;
  int iLangid_local;
  Fts3Table *p_local;
  
  pStmt._0_4_ = 0;
  psStack_38 = (sqlite3_stmt *)0x0;
  pStmt._4_4_ = nTerm;
  _rc = zTerm;
  zTerm_local._4_4_ = iLevel;
  local_18 = iIndex;
  iLevel_local = iLangid;
  _iIndex_local = p;
  if ((iLevel < 0) && (p->aIndex != (Fts3Index *)0x0)) {
    pSeg_1 = (Fts3SegReader *)0x0;
    local_81 = isPrefix != 0 || isScan != 0;
    pStmt._0_4_ = sqlite3Fts3SegReaderPending(p,iIndex,zTerm,nTerm,(uint)local_81,&pSeg_1);
    if (((int)pStmt == 0) && (pSeg_1 != (Fts3SegReader *)0x0)) {
      pStmt._0_4_ = fts3SegReaderCursorAppend(pCsr,pSeg_1);
    }
  }
  if (zTerm_local._4_4_ == -1) {
LAB_001f4a15:
    iVar1 = sqlite3_reset(psStack_38);
    if ((int)pStmt == 0x65) {
      pStmt._0_4_ = iVar1;
    }
    return (int)pStmt;
  }
  if ((int)pStmt == 0) {
    pStmt._0_4_ = sqlite3Fts3AllSegdirs
                            (_iIndex_local,iLevel_local,local_18,zTerm_local._4_4_,
                             &stack0xffffffffffffffc8);
  }
  do {
    bVar2 = false;
    if ((int)pStmt == 0) {
      pStmt._0_4_ = sqlite3_step(psStack_38);
      bVar2 = (int)pStmt == 100;
    }
    if (!bVar2) goto LAB_001f4a15;
    iStartBlock = 0;
    iLeavesEndBlock = sqlite3_column_int64(psStack_38,1);
    iEndBlock = sqlite3_column_int64(psStack_38,2);
    iEndBlock_00 = sqlite3_column_int64(psStack_38,3);
    iVar1 = sqlite3_column_bytes(psStack_38,4);
    zNode = (char *)sqlite3_column_blob(psStack_38,4);
    if (((iLeavesEndBlock != 0) && (_rc != (char *)0x0)) && (zNode != (char *)0x0)) {
      if (isPrefix == 0) {
        local_b0 = (sqlite3_int64 *)0x0;
      }
      else {
        local_b0 = &iEndBlock;
      }
      pStmt._0_4_ = fts3SelectLeaf(_iIndex_local,_rc,pStmt._4_4_,zNode,iVar1,&iLeavesEndBlock,
                                   local_b0);
      if ((int)pStmt != 0) goto LAB_001f4a15;
      if ((isPrefix == 0) && (isScan == 0)) {
        iEndBlock = iLeavesEndBlock;
      }
      pStmt._0_4_ = 0;
    }
    local_b1 = isPrefix == 0 && isScan == 0;
    pStmt._0_4_ = sqlite3Fts3SegReaderNew
                            (pCsr->nSegment + 1,(uint)local_b1,iLeavesEndBlock,iEndBlock,
                             iEndBlock_00,zNode,iVar1,(Fts3SegReader **)&iStartBlock);
    if ((int)pStmt != 0) goto LAB_001f4a15;
    pStmt._0_4_ = fts3SegReaderCursorAppend(pCsr,(Fts3SegReader *)iStartBlock);
  } while( true );
}

Assistant:

static int fts3SegReaderCursor(
  Fts3Table *p,                   /* FTS3 table handle */
  int iLangid,                    /* Language id */
  int iIndex,                     /* Index to search (from 0 to p->nIndex-1) */
  int iLevel,                     /* Level of segments to scan */
  const char *zTerm,              /* Term to query for */
  int nTerm,                      /* Size of zTerm in bytes */
  int isPrefix,                   /* True for a prefix search */
  int isScan,                     /* True to scan from zTerm to EOF */
  Fts3MultiSegReader *pCsr        /* Cursor object to populate */
){
  int rc = SQLITE_OK;             /* Error code */
  sqlite3_stmt *pStmt = 0;        /* Statement to iterate through segments */
  int rc2;                        /* Result of sqlite3_reset() */

  /* If iLevel is less than 0 and this is not a scan, include a seg-reader 
  ** for the pending-terms. If this is a scan, then this call must be being
  ** made by an fts4aux module, not an FTS table. In this case calling
  ** Fts3SegReaderPending might segfault, as the data structures used by 
  ** fts4aux are not completely populated. So it's easiest to filter these
  ** calls out here.  */
  if( iLevel<0 && p->aIndex ){
    Fts3SegReader *pSeg = 0;
    rc = sqlite3Fts3SegReaderPending(p, iIndex, zTerm, nTerm, isPrefix||isScan, &pSeg);
    if( rc==SQLITE_OK && pSeg ){
      rc = fts3SegReaderCursorAppend(pCsr, pSeg);
    }
  }

  if( iLevel!=FTS3_SEGCURSOR_PENDING ){
    if( rc==SQLITE_OK ){
      rc = sqlite3Fts3AllSegdirs(p, iLangid, iIndex, iLevel, &pStmt);
    }

    while( rc==SQLITE_OK && SQLITE_ROW==(rc = sqlite3_step(pStmt)) ){
      Fts3SegReader *pSeg = 0;

      /* Read the values returned by the SELECT into local variables. */
      sqlite3_int64 iStartBlock = sqlite3_column_int64(pStmt, 1);
      sqlite3_int64 iLeavesEndBlock = sqlite3_column_int64(pStmt, 2);
      sqlite3_int64 iEndBlock = sqlite3_column_int64(pStmt, 3);
      int nRoot = sqlite3_column_bytes(pStmt, 4);
      char const *zRoot = sqlite3_column_blob(pStmt, 4);

      /* If zTerm is not NULL, and this segment is not stored entirely on its
      ** root node, the range of leaves scanned can be reduced. Do this. */
      if( iStartBlock && zTerm && zRoot ){
        sqlite3_int64 *pi = (isPrefix ? &iLeavesEndBlock : 0);
        rc = fts3SelectLeaf(p, zTerm, nTerm, zRoot, nRoot, &iStartBlock, pi);
        if( rc!=SQLITE_OK ) goto finished;
        if( isPrefix==0 && isScan==0 ) iLeavesEndBlock = iStartBlock;
      }
 
      rc = sqlite3Fts3SegReaderNew(pCsr->nSegment+1, 
          (isPrefix==0 && isScan==0),
          iStartBlock, iLeavesEndBlock, 
          iEndBlock, zRoot, nRoot, &pSeg
      );
      if( rc!=SQLITE_OK ) goto finished;
      rc = fts3SegReaderCursorAppend(pCsr, pSeg);
    }
  }

 finished:
  rc2 = sqlite3_reset(pStmt);
  if( rc==SQLITE_DONE ) rc = rc2;

  return rc;
}